

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManOrigIdsInit(Gia_Man_t *p)

{
  uint nCap;
  Vec_Int_t *pVVar1;
  ulong uVar2;
  ulong uVar3;
  
  Vec_IntFreeP(&p->vIdsOrig);
  nCap = p->nObjs;
  pVVar1 = Vec_IntAlloc(nCap);
  pVVar1->nSize = nCap;
  uVar2 = 0;
  uVar3 = (ulong)nCap;
  if ((int)nCap < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pVVar1->pArray[uVar2] = (int)uVar2;
  }
  p->vIdsOrig = pVVar1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Manipulating original IDs.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManOrigIdsInit( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartNatural( Gia_ManObjNum(p) );
}